

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::ListOp<tinyusdz::Payload>::ClearAndMakeExplicit(ListOp<tinyusdz::Payload> *this)

{
  ListOp<tinyusdz::Payload> *this_local;
  
  ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::clear(&this->explicit_items)
  ;
  ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::clear(&this->added_items);
  ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::clear
            (&this->prepended_items);
  ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::clear(&this->appended_items)
  ;
  ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::clear(&this->deleted_items);
  ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::clear(&this->ordered_items);
  this->is_explicit = true;
  return;
}

Assistant:

void ClearAndMakeExplicit() {
    explicit_items.clear();
    added_items.clear();
    prepended_items.clear();
    appended_items.clear();
    deleted_items.clear();
    ordered_items.clear();

    is_explicit = true;
  }